

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meta_pipeline.cpp
# Opt level: O3

void __thiscall
duckdb::MetaPipeline::GetMetaPipelines
          (MetaPipeline *this,vector<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_true> *result,
          bool recursive,bool skip)

{
  pointer psVar1;
  MetaPipeline *this_00;
  undefined7 in_register_00000009;
  shared_ptr<duckdb::MetaPipeline,_true> *child;
  pointer __x;
  enable_shared_from_this<duckdb::MetaPipeline> local_30;
  
  if ((int)CONCAT71(in_register_00000009,skip) == 0) {
    enable_shared_from_this<duckdb::MetaPipeline>::shared_from_this(&local_30);
    ::std::
    vector<duckdb::shared_ptr<duckdb::MetaPipeline,true>,std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,true>>>
    ::emplace_back<duckdb::shared_ptr<duckdb::MetaPipeline,true>>
              ((vector<duckdb::shared_ptr<duckdb::MetaPipeline,true>,std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,true>>>
                *)result,(shared_ptr<duckdb::MetaPipeline,_true> *)&local_30);
    if (local_30.__weak_this_.internal.
        super___weak_ptr<duckdb::MetaPipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_30.__weak_this_.internal.
                 super___weak_ptr<duckdb::MetaPipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
  }
  psVar1 = (this->children).
           super_vector<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
           .
           super__Vector_base<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (__x = (this->children).
             super_vector<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
             .
             super__Vector_base<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start; __x != psVar1; __x = __x + 1) {
    ::std::
    vector<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
    ::push_back(&result->
                 super_vector<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
                ,__x);
    if (recursive) {
      this_00 = shared_ptr<duckdb::MetaPipeline,_true>::operator->(__x);
      GetMetaPipelines(this_00,result,true,true);
    }
  }
  return;
}

Assistant:

void MetaPipeline::GetMetaPipelines(vector<shared_ptr<MetaPipeline>> &result, bool recursive, bool skip) {
	if (!skip) {
		result.push_back(shared_from_this());
	}
	for (auto &child : children) {
		result.push_back(child);
		if (recursive) {
			child->GetMetaPipelines(result, true, true);
		}
	}
}